

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Obj_t * Aig_ManDupDfsGuided_rec(Aig_Man_t *pNew,Aig_Man_t *p,Aig_Obj_t *pObj)

{
  Aig_Obj_t **ppAVar1;
  int iVar2;
  Aig_Type_t Type;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *local_38;
  Aig_Obj_t *pEquivNew;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  Aig_Man_t *pNew_local;
  
  local_38 = (Aig_Obj_t *)0x0;
  if ((pObj->field_5).pData == (void *)0x0) {
    iVar2 = Aig_ObjIsCi(pObj);
    if (iVar2 == 0) {
      if ((p->pEquivs != (Aig_Obj_t **)0x0) &&
         (pAVar3 = Aig_ObjEquiv(p,pObj), pAVar3 != (Aig_Obj_t *)0x0)) {
        pAVar3 = Aig_ObjEquiv(p,pObj);
        local_38 = Aig_ManDupDfsGuided_rec(pNew,p,pAVar3);
      }
      pAVar3 = Aig_ObjFanin0(pObj);
      pAVar3 = Aig_ManDupDfsGuided_rec(pNew,p,pAVar3);
      if (pAVar3 == (Aig_Obj_t *)0x0) {
        pNew_local = (Aig_Man_t *)0x0;
      }
      else {
        iVar2 = Aig_ObjIsBuf(pObj);
        if (iVar2 == 0) {
          pAVar3 = Aig_ObjFanin1(pObj);
          pAVar3 = Aig_ManDupDfsGuided_rec(pNew,p,pAVar3);
          if (pAVar3 == (Aig_Obj_t *)0x0) {
            pNew_local = (Aig_Man_t *)0x0;
          }
          else {
            pAVar3 = Aig_ObjChild0Copy(pObj);
            pAVar4 = Aig_ObjChild1Copy(pObj);
            Type = Aig_ObjType(pObj);
            pNew_local = (Aig_Man_t *)Aig_Oper(pNew,pAVar3,pAVar4,Type);
            if (local_38 != (Aig_Obj_t *)0x0) {
              if (pNew->pEquivs != (Aig_Obj_t **)0x0) {
                pAVar3 = Aig_Regular(local_38);
                ppAVar1 = pNew->pEquivs;
                pAVar4 = Aig_Regular((Aig_Obj_t *)pNew_local);
                ppAVar1[pAVar4->Id] = pAVar3;
              }
              if (pNew->pReprs != (Aig_Obj_t **)0x0) {
                pAVar3 = Aig_Regular((Aig_Obj_t *)pNew_local);
                ppAVar1 = pNew->pReprs;
                pAVar4 = Aig_Regular(local_38);
                ppAVar1[pAVar4->Id] = pAVar3;
              }
            }
            (pObj->field_5).pData = pNew_local;
          }
        }
        else {
          pNew_local = (Aig_Man_t *)Aig_ObjChild0Copy(pObj);
          (pObj->field_5).pData = pNew_local;
        }
      }
    }
    else {
      pNew_local = (Aig_Man_t *)0x0;
    }
  }
  else {
    pNew_local = (Aig_Man_t *)(pObj->field_5).pData;
  }
  return (Aig_Obj_t *)pNew_local;
}

Assistant:

Aig_Obj_t * Aig_ManDupDfsGuided_rec( Aig_Man_t * pNew, Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pObjNew, * pEquivNew = NULL;
    if ( pObj->pData )
        return (Aig_Obj_t *)pObj->pData;
    if ( Aig_ObjIsCi(pObj) )
        return NULL;
    if ( p->pEquivs && Aig_ObjEquiv(p, pObj) )
        pEquivNew = Aig_ManDupDfsGuided_rec( pNew, p, Aig_ObjEquiv(p, pObj) );
    if ( !Aig_ManDupDfsGuided_rec( pNew, p, Aig_ObjFanin0(pObj) ) )
        return NULL;
    if ( Aig_ObjIsBuf(pObj) )
        return (Aig_Obj_t *)(pObj->pData = Aig_ObjChild0Copy(pObj));
    if ( !Aig_ManDupDfsGuided_rec( pNew, p, Aig_ObjFanin1(pObj) ) )
        return NULL;
    pObjNew = Aig_Oper( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj), Aig_ObjType(pObj) );
    if ( pEquivNew )
    {
        if ( pNew->pEquivs )
            pNew->pEquivs[Aig_Regular(pObjNew)->Id] = Aig_Regular(pEquivNew);        
        if ( pNew->pReprs )
            pNew->pReprs[Aig_Regular(pEquivNew)->Id] = Aig_Regular(pObjNew);
    }
    return (Aig_Obj_t *)(pObj->pData = pObjNew);
}